

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
FxIfStatement::FxIfStatement
          (FxIfStatement *this,FxExpression *cond,FxExpression *true_part,FxExpression *false_part,
          FScriptPosition *pos)

{
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,pos);
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_IfStatement;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxIfStatement_0070ce78;
  this->Condition = cond;
  this->WhenTrue = true_part;
  this->WhenFalse = false_part;
  if (true_part != (FxExpression *)0x0) {
    true_part->NeedResult = false;
  }
  if (false_part != (FxExpression *)0x0) {
    false_part->NeedResult = false;
  }
  if (cond != (FxExpression *)0x0) {
    return;
  }
  __assert_fail("cond != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x22be,
                "FxIfStatement::FxIfStatement(FxExpression *, FxExpression *, FxExpression *, const FScriptPosition &)"
               );
}

Assistant:

FxIfStatement::FxIfStatement(FxExpression *cond, FxExpression *true_part,
	FxExpression *false_part, const FScriptPosition &pos)
: FxExpression(EFX_IfStatement, pos)
{
	Condition = cond;
	WhenTrue = true_part;
	WhenFalse = false_part;
	if (WhenTrue != nullptr) WhenTrue->NeedResult = false;
	if (WhenFalse != nullptr) WhenFalse->NeedResult = false;
	assert(cond != nullptr);
}